

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

TimeConversion *
absl::ConvertDateTime
          (TimeConversion *__return_storage_ptr__,year_t year,int mon,int day,int hour,int min,
          int sec,undefined8 param_8)

{
  undefined8 uVar1;
  int64_t iVar2;
  fields fVar3;
  CivilSecond ct;
  TimeInfo ti;
  undefined8 local_70;
  TimeInfo local_68;
  
  local_70 = param_8;
  if (year < 0x45d964b801) {
    if (-0x45d964b801 < year) {
      fVar3 = time_internal::cctz::detail::impl::n_sec
                        (year,(long)mon,(long)day,(long)hour,(long)min,(long)sec);
      ct.f_._8_8_ = fVar3._8_8_ & 0xffffffffff;
      ct.f_.y = fVar3.y;
      TimeZone::At(&local_68,(TimeZone *)&local_70,ct);
      (__return_storage_ptr__->pre).rep_.rep_hi_ = 0;
      (__return_storage_ptr__->pre).rep_.rep_lo_ = 0;
      (__return_storage_ptr__->trans).rep_.rep_hi_ = 0;
      (__return_storage_ptr__->trans).rep_.rep_lo_ = 0;
      (__return_storage_ptr__->post).rep_.rep_hi_ = 0;
      (__return_storage_ptr__->post).rep_.rep_lo_ = 0;
      (__return_storage_ptr__->pre).rep_.rep_hi_ = local_68.pre.rep_.rep_hi_;
      (__return_storage_ptr__->pre).rep_.rep_lo_ = local_68.pre.rep_.rep_lo_;
      *(undefined4 *)&(__return_storage_ptr__->pre).rep_.field_0xc = local_68.pre.rep_._12_4_;
      (__return_storage_ptr__->trans).rep_.rep_hi_ = local_68.trans.rep_.rep_hi_;
      (__return_storage_ptr__->trans).rep_.rep_lo_ = local_68.trans.rep_.rep_lo_;
      *(undefined4 *)&(__return_storage_ptr__->trans).rep_.field_0xc = local_68.trans.rep_._12_4_;
      (__return_storage_ptr__->post).rep_.rep_hi_ = local_68.post.rep_.rep_hi_;
      (__return_storage_ptr__->post).rep_.rep_lo_ = local_68.post.rep_.rep_lo_;
      *(undefined4 *)&(__return_storage_ptr__->post).rep_.field_0xc = local_68.post.rep_._12_4_;
      if (local_68.kind < (REPEATED|SKIPPED)) {
        __return_storage_ptr__->kind = local_68.kind;
      }
      __return_storage_ptr__->normalized = false;
      if ((((fVar3.m == mon && fVar3.y == year) && (fVar3.d == day)) &&
          (fVar3._8_4_ >> 0x18 == min && fVar3.hh == hour)) && (fVar3._9_4_ >> 0x18 == sec)) {
        return __return_storage_ptr__;
      }
      goto LAB_00150eeb;
    }
    iVar2 = -0x8000000000000000;
  }
  else {
    iVar2 = 0x7fffffffffffffff;
  }
  (__return_storage_ptr__->post).rep_.rep_hi_ = iVar2;
  (__return_storage_ptr__->post).rep_.rep_lo_ = 0xffffffff;
  iVar2 = (__return_storage_ptr__->post).rep_.rep_hi_;
  uVar1 = *(undefined8 *)&(__return_storage_ptr__->post).rep_.rep_lo_;
  (__return_storage_ptr__->trans).rep_.rep_hi_ = iVar2;
  *(undefined8 *)&(__return_storage_ptr__->trans).rep_.rep_lo_ = uVar1;
  (__return_storage_ptr__->pre).rep_.rep_hi_ = iVar2;
  *(undefined8 *)&(__return_storage_ptr__->pre).rep_.rep_lo_ = uVar1;
  __return_storage_ptr__->kind = UNIQUE;
LAB_00150eeb:
  __return_storage_ptr__->normalized = true;
  return __return_storage_ptr__;
}

Assistant:

absl::TimeConversion ConvertDateTime(int64_t year, int mon, int day, int hour,
                                     int min, int sec, TimeZone tz) {
  // Avoids years that are too extreme for CivilSecond to normalize.
  if (year > 300000000000) return InfiniteFutureTimeConversion();
  if (year < -300000000000) return InfinitePastTimeConversion();

  const CivilSecond cs(year, mon, day, hour, min, sec);
  const auto ti = tz.At(cs);

  TimeConversion tc;
  tc.pre = ti.pre;
  tc.trans = ti.trans;
  tc.post = ti.post;
  switch (ti.kind) {
    case TimeZone::TimeInfo::UNIQUE:
      tc.kind = TimeConversion::UNIQUE;
      break;
    case TimeZone::TimeInfo::SKIPPED:
      tc.kind = TimeConversion::SKIPPED;
      break;
    case TimeZone::TimeInfo::REPEATED:
      tc.kind = TimeConversion::REPEATED;
      break;
  }
  tc.normalized = false;
  if (year != cs.year() || mon != cs.month() || day != cs.day() ||
      hour != cs.hour() || min != cs.minute() || sec != cs.second()) {
    tc.normalized = true;
  }
  return tc;
}